

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O0

uint mwDrop_(uint kb,int type,int silent)

{
  mwGrabData *pmVar1;
  unsigned_long uVar2;
  char *pcVar3;
  void *pvVar4;
  void *p;
  mwGrabData *pr;
  mwGrabData *tmp;
  mwGrabData *gd;
  uint i;
  int silent_local;
  int type_local;
  uint kb_local;
  
  if ((mwGrabList == (mwGrabData *)0x0) && (kb == 0)) {
    type_local = 0;
  }
  else {
    silent_local = kb;
    if (kb == 0) {
      silent_local = 60000;
    }
    type_local = silent_local;
    p = (void *)0x0;
    tmp = mwGrabList;
    while (silent_local != 0) {
      if (tmp == (mwGrabData *)0x0) {
        if ((type_local != silent_local) && (silent == 0)) {
          pcVar3 = mwGrabType(type);
          mwWrite("dropped: all %s memory (%u kb)\n",pcVar3,(ulong)(uint)(type_local - silent_local)
                 );
          mwFlush();
        }
        return type_local - silent_local;
      }
      if (tmp->type == type) {
        if (p != (void *)0x0) {
          *(mwGrabData **)p = tmp->next;
        }
        silent_local = silent_local + -1;
        if (mwGrabList == tmp) {
          mwGrabList = tmp->next;
        }
        pmVar1 = tmp->next;
        pvVar4 = mwTestMem(tmp->blob,0x3f4,type);
        uVar2 = mwCounter;
        if (pvVar4 != (void *)0x0) {
          pcVar3 = mwGrabType(type);
          mwWrite("wild pointer: <%ld> %s memory hit at %p\n",uVar2,pcVar3,pvVar4);
          mwFlush();
        }
        mwGrabSize = mwGrabSize + -0x400;
        free(tmp);
        tmp = pmVar1;
      }
      else {
        p = tmp;
        tmp = tmp->next;
      }
    }
    if (silent == 0) {
      pcVar3 = mwGrabType(type);
      mwWrite("dropped: %u kilobytes of %s memory\n",(ulong)(uint)type_local,pcVar3);
      mwFlush();
    }
  }
  return type_local;
}

Assistant:

static unsigned mwDrop_(unsigned kb, int type, int silent)
{
	unsigned i = kb;
	mwGrabData *gd, *tmp, *pr;
	const void *p;

	if (mwGrabList == NULL && kb == 0) {
		return 0;
	}
	if (!kb) {
		i = kb = 60000U;
	}

	pr = NULL;
	gd = mwGrabList;
	for (; kb;) {
		if (gd == NULL) {
			if (i - kb > 0 && !silent) {
				mwWrite("dropped: all %s memory (%u kb)\n", mwGrabType(type), i - kb);
				FLUSH();
			}
			return i - kb;
		}
		if (gd->type == type) {
			if (pr) {
				pr->next = gd->next;
			}
			kb --;
			tmp = gd;
			if (mwGrabList == gd) {
				mwGrabList = gd->next;
			}
			gd = gd->next;
			p = mwTestMem(tmp->blob, sizeof(tmp->blob), type);
			if (p != NULL) {
				mwWrite("wild pointer: <%ld> %s memory hit at %p\n",
						mwCounter, mwGrabType(type), p);
				FLUSH();
			}
			mwGrabSize -= (long) sizeof(mwGrabData);
			free(tmp);
		} else {
			pr = gd;
			gd = gd->next;
		}
	}
	if (!silent) {
		mwWrite("dropped: %u kilobytes of %s memory\n", i, mwGrabType(type));
		FLUSH();
	}
	return i;
}